

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O1

bool __thiscall Hospital::validate_String_Must_Be_Number(Hospital *this,string *id)

{
  char *pcVar1;
  ulong uVar2;
  char *pcVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar2 = id->_M_string_length;
  bVar5 = uVar2 == 0;
  if ((!bVar5) && (pcVar3 = (id->_M_dataplus)._M_p, (byte)(*pcVar3 - 0x30U) < 10)) {
    uVar4 = 1;
    do {
      if (*pcVar3 == '0') {
        return bVar5;
      }
      bVar5 = uVar2 <= uVar4;
      if (uVar2 == uVar4) {
        return bVar5;
      }
      pcVar1 = pcVar3 + uVar4;
      uVar4 = uVar4 + 1;
    } while ((byte)(*pcVar1 - 0x30U) < 10);
  }
  return bVar5;
}

Assistant:

bool Hospital:: validate_String_Must_Be_Number(string id){
    int countr = 0;
    for (int i = 0; i <id.length() ; ++i) {
        if(id[i]>=48 && id[i]<=57 && id[0]!='0')countr ++;
        else {
            return false;
        }
    }
    if(countr == id.length())return true ;
}